

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O1

void Inline::TraceInlining
               (FunctionJITTimeInfo *inliner,char16 *inlineeName,
               char16 *inlineeFunctionIdandNumberString,uint inlineeByteCodeCount,
               FunctionJITTimeInfo *topFunc,uint inlinedByteCodeCount,FunctionJITTimeInfo *inlinee,
               uint callSiteId,bool inLoopBody,uint builtIn)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *puVar7;
  JITTimeFunctionBody *pJVar8;
  char16 *pcVar9;
  char16 *pcVar10;
  undefined4 extraout_var;
  char16 *pcVar11;
  char16 *pcVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char16 *pcVar13;
  char16 *pcVar14;
  char16_t *pcVar15;
  undefined4 in_register_0000008c;
  undefined8 uVar16;
  char16 local_188 [4];
  char16 debugStringBuffer3 [42];
  wchar local_128 [4];
  char16 debugStringBuffer [42];
  wchar local_c8 [4];
  char16 debugStringBuffer2 [42];
  char16 *local_48;
  
  uVar16 = CONCAT44(in_register_0000008c,inlinedByteCodeCount);
  local_48 = inlineeName;
  if (inlineeName == (char16 *)0x0) {
    local_48 = local_188;
    iVar3 = swprintf_s((char16_t_conflict *)local_48,0x2a,(char16_t_conflict *)L"built In Id: %u",
                       (ulong)builtIn);
    if (iVar3 < 0xf) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x176d,"(len > 14)","len > 14");
      if (!bVar2) goto LAB_0055553b;
      *puVar7 = 0;
    }
  }
  uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,InlinePhase,uVar4,uVar5);
  if (bVar2) {
    pcVar15 = L"";
    if (inLoopBody) {
      pcVar15 = L"IN LOOP BODY";
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_128);
    pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
    uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
    pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_c8);
    pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
    uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
    Output::Print(L"INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar15,local_48,inlineeFunctionIdandNumberString,(ulong)inlineeByteCodeCount,
                  pcVar9,pcVar10,CONCAT44(extraout_var,uVar4),uVar16,pcVar11,pcVar12,(ulong)uVar5,
                  (ulong)callSiteId);
  }
  pcVar15 = L"";
  uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
  uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar4,uVar5);
  if (bVar2) {
    if (inLoopBody) {
      pcVar15 = L"IN LOOP BODY";
    }
    pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
    pcVar9 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_128);
    pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
    uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
    pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
    pcVar11 = JITTimeFunctionBody::GetDisplayName(pJVar8);
    pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_c8);
    pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
    uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
    Output::Print(L"INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"
                  ,pcVar15,local_48,inlineeFunctionIdandNumberString,(ulong)inlineeByteCodeCount,
                  pcVar9,pcVar10,CONCAT44(extraout_var_00,uVar4),uVar16,pcVar11,pcVar12,(ulong)uVar5
                  ,(ulong)callSiteId);
    Output::Flush();
  }
  if (builtIn == 0xffffffff) {
    if (inliner == (FunctionJITTimeInfo *)0x0 || inlinee == (FunctionJITTimeInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                         ,0x1780,"(inliner && inlinee)","inliner && inlinee");
      if (!bVar2) {
LAB_0055553b:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar7 = 0;
    }
    uVar4 = FunctionJITTimeInfo::GetSourceContextId(inliner);
    uVar5 = FunctionJITTimeInfo::GetSourceContextId(inlinee);
    if (uVar4 != uVar5) {
      uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,InlinePhase,uVar4,uVar5);
      if (bVar2) {
        pcVar9 = FunctionJITTimeInfo::GetDisplayName(inlinee);
        pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_128);
        pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
        uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        pcVar11 = FunctionJITTimeInfo::GetDisplayName(inliner);
        pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_c8);
        pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
        uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_188);
        pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
        uVar6 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,pcVar9,pcVar10,uVar4,pcVar11,pcVar12,CONCAT44(extraout_var_01,uVar5),uVar16,
                      pcVar13,pcVar14,(ulong)uVar6);
      }
      uVar4 = FunctionJITTimeInfo::GetSourceContextId(topFunc);
      uVar5 = FunctionJITTimeInfo::GetLocalFunctionId(topFunc);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,InlinePhase,uVar4,uVar5);
      if (bVar2) {
        pcVar9 = FunctionJITTimeInfo::GetDisplayName(inlinee);
        pcVar10 = FunctionJITTimeInfo::GetDebugNumberSet(inlinee,(wchar (*) [42])local_128);
        pJVar8 = FunctionJITTimeInfo::GetBody(inlinee);
        uVar4 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        pcVar11 = FunctionJITTimeInfo::GetDisplayName(inliner);
        pcVar12 = FunctionJITTimeInfo::GetDebugNumberSet(inliner,(wchar (*) [42])local_c8);
        pJVar8 = FunctionJITTimeInfo::GetBody(inliner);
        uVar5 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
        pcVar13 = JITTimeFunctionBody::GetDisplayName(pJVar8);
        pcVar14 = FunctionJITTimeInfo::GetDebugNumberSet(topFunc,(wchar (*) [42])local_188);
        pJVar8 = FunctionJITTimeInfo::GetBody(topFunc);
        uVar6 = JITTimeFunctionBody::GetByteCodeCount(pJVar8);
        Output::Print(L"INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"
                      ,pcVar9,pcVar10,uVar4,pcVar11,pcVar12,(ulong)uVar5,uVar16,pcVar13,pcVar14,
                      (ulong)uVar6);
        Output::Flush();
      }
    }
  }
  return;
}

Assistant:

void Inline::TraceInlining(const FunctionJITTimeInfo *const inliner, const char16* inlineeName, const char16* inlineeFunctionIdandNumberString, uint inlineeByteCodeCount,
    const FunctionJITTimeInfo* topFunc, uint inlinedByteCodeCount, const FunctionJITTimeInfo *const inlinee, uint callSiteId, bool inLoopBody, uint builtIn)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer2[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    char16 debugStringBuffer3[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (inlineeName == nullptr)
    {

        int len = swprintf_s(debugStringBuffer3, MAX_FUNCTION_BODY_DEBUG_STRING_SIZE, _u("built In Id: %u"), builtIn);
        Assert(len > 14);
        inlineeName = debugStringBuffer3;
    }
    INLINE_TRACE_AND_TESTTRACE(_u("INLINING %s: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\tCallSiteId: %d\n"),
        inLoopBody ? _u("IN LOOP BODY") : _u(""),
        inlineeName, inlineeFunctionIdandNumberString, inlineeByteCodeCount,
        inliner->GetBody()->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer), inliner->GetBody()->GetByteCodeCount(), inlinedByteCodeCount,
        topFunc->GetBody()->GetDisplayName(),
        topFunc->GetDebugNumberSet(debugStringBuffer2), topFunc->GetBody()->GetByteCodeCount(),
        callSiteId
    );

    // Now Trace inlining across files cases

    if (builtIn != -1)  // built-in functions
    {
        return;
    }

    Assert(inliner && inlinee);

    if (inliner->GetSourceContextId() != inlinee->GetSourceContextId())
    {
        INLINE_TRACE_AND_TESTTRACE(_u("INLINING_ACROSS_FILES: Inlinee: %s (%s)\tSize: %d\tCaller: %s (%s)\tSize: %d\tInlineCount: %d\tRoot: %s (%s)\tSize: %d\n"),
            inlinee->GetDisplayName(), inlinee->GetDebugNumberSet(debugStringBuffer), inlinee->GetBody()->GetByteCodeCount(),
            inliner->GetDisplayName(), inliner->GetDebugNumberSet(debugStringBuffer2), inliner->GetBody()->GetByteCodeCount(), inlinedByteCodeCount,
            topFunc->GetBody()->GetDisplayName(), topFunc->GetDebugNumberSet(debugStringBuffer3), topFunc->GetBody()->GetByteCodeCount()
        );
    }

}